

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O1

bool P_CreateCeiling(sector_t *sec,ECeiling type,line_t *line,int tag,double speed,double speed2,
                    double height,int crush,int silent,int change,ECrushMode hexencrush)

{
  double *pdVar1;
  byte bVar2;
  ECeiling EVar3;
  DCeiling *this;
  double *pdVar4;
  sector_t *psVar5;
  secspecial_t *spec;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  vertex_t *local_60;
  double local_58;
  double local_50;
  double local_48;
  int local_40;
  int local_3c;
  line_t *local_38;
  
  local_58 = height;
  local_50 = speed;
  local_48 = speed2;
  local_3c = tag;
  bVar2 = sector_t::PlaneMoving(sec,1);
  if ((bool)bVar2) goto LAB_004e9a33;
  local_40 = crush;
  this = (DCeiling *)
         M_Malloc_Dbg(0xa8,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                      ,0x1f7);
  DMovingCeiling::DMovingCeiling((DMovingCeiling *)this,sec,true);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_00849d20;
  (this->m_NewSpecial).damagetype = (FName)0x0;
  (this->m_NewSpecial).damageamount = 0;
  (this->m_NewSpecial).special = 0;
  (this->m_NewSpecial).damageinterval = 0;
  (this->m_NewSpecial).leakydamage = 0;
  *(undefined2 *)&(this->m_NewSpecial).field_0xe = 0;
  (this->m_NewSpecial).Flags = 0;
  this->m_Crush = -1;
  this->m_CrushMode = crushDoom;
  this->m_Speed1 = local_50;
  this->m_Speed = local_50;
  this->m_Speed2 = local_48;
  this->m_Silent = silent & 0xfffffffb;
  local_60 = (*sec->lines)->v1;
  dVar10 = 0.0;
  local_38 = line;
  switch(type) {
  case ceilLowerByValue:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
    dVar10 = ((sec->ceilingplane).D + dVar7 + dVar8) * (sec->ceilingplane).negiC - local_58;
    goto LAB_004e94aa;
  case ceilRaiseByValue:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
    dVar10 = ((sec->ceilingplane).D + dVar7 + dVar8) * (sec->ceilingplane).negiC + local_58;
    goto LAB_004e9868;
  case ceilMoveToValue:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar9 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
    dVar8 = -((sec->ceilingplane).normal.Z * local_58 + dVar9 + dVar7);
    dVar10 = local_58;
    if (((sec->ceilingplane).D + dVar7 + dVar9) * (sec->ceilingplane).negiC <= local_58) {
      this->m_TopHeight = dVar8;
      goto LAB_004e98d6;
    }
    this->m_BottomHeight = dVar8;
    goto LAB_004e978d;
  case ceilLowerToHighestFloor:
    dVar10 = sector_t::FindHighestFloorSurrounding(sec,&local_60);
    goto LAB_004e947c;
  case ceilLowerInstant:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
    dVar10 = ((sec->ceilingplane).D + dVar7 + dVar8) * (sec->ceilingplane).negiC - local_58;
    this->m_BottomHeight = -((sec->ceilingplane).normal.Z * dVar10 + dVar8 + dVar7);
    this->m_Direction = -1;
    goto LAB_004e981f;
  case ceilRaiseInstant:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
    dVar10 = ((sec->ceilingplane).D + dVar7 + dVar8) * (sec->ceilingplane).negiC + local_58;
    this->m_TopHeight = -((sec->ceilingplane).normal.Z * dVar10 + dVar8 + dVar7);
    this->m_Direction = 1;
LAB_004e981f:
    this->m_Speed = local_58;
    goto switchD_004e945b_caseD_8;
  case ceilCrushAndRaise:
  case ceilCrushRaiseAndStay:
    this->m_TopHeight = (sec->ceilingplane).D;
  case ceilLowerAndCrush:
  case ceilLowerToFloor:
    dVar10 = sector_t::FindHighestFloorPoint(sec,&local_60);
LAB_004e947c:
    dVar10 = dVar10 + local_58;
LAB_004e948f:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
LAB_004e94aa:
    dVar8 = dVar8 + dVar7;
    dVar7 = (sec->ceilingplane).normal.Z * dVar10;
    goto LAB_004e977b;
  default:
    goto switchD_004e945b_caseD_8;
  case ceilRaiseToNearest:
    dVar10 = sector_t::FindNextHighestCeiling(sec,&local_60);
    break;
  case ceilLowerToLowest:
    dVar10 = sector_t::FindLowestCeilingSurrounding(sec,&local_60);
    goto LAB_004e9742;
  case ceilRaiseToHighest:
    dVar10 = sector_t::FindHighestCeilingSurrounding(sec,&local_60);
    break;
  case ceilLowerToHighest:
    dVar10 = sector_t::FindHighestCeilingSurrounding(sec,&local_60);
    goto LAB_004e9742;
  case ceilRaiseToLowest:
    dVar10 = sector_t::FindLowestCeilingSurrounding(sec,&local_60);
    break;
  case ceilLowerToNearest:
    dVar10 = sector_t::FindNextLowestCeiling(sec,&local_60);
LAB_004e9742:
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y +
            (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar7 = dVar10 * (sec->ceilingplane).normal.Z;
LAB_004e977b:
    this->m_BottomHeight = -(dVar7 + dVar8);
LAB_004e978d:
    this->m_Direction = -1;
    goto switchD_004e945b_caseD_8;
  case ceilRaiseToHighestFloor:
    dVar10 = sector_t::FindHighestFloorSurrounding(sec,&local_60);
    break;
  case ceilRaiseToFloor:
    dVar10 = sector_t::FindHighestFloorPoint(sec,&local_60);
    dVar10 = dVar10 + local_58;
    goto LAB_004e984d;
  case ceilRaiseByTexture:
    local_48 = ((sec->ceilingplane).normal.Y * (local_60->p).Y +
               (sec->ceilingplane).normal.X * (local_60->p).X + (sec->ceilingplane).D) *
               (sec->ceilingplane).negiC;
    dVar10 = sector_t::FindShortestUpperAround(sec);
    dVar10 = dVar10 + local_48;
LAB_004e984d:
    dVar7 = (sec->ceilingplane).normal.X * (local_60->p).X;
    dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y;
LAB_004e9868:
    dVar8 = dVar8 + dVar7;
    dVar7 = (sec->ceilingplane).normal.Z * dVar10;
    goto LAB_004e98c4;
  case ceilLowerByTexture:
    local_50 = ((sec->ceilingplane).normal.Y * (local_60->p).Y +
               (sec->ceilingplane).normal.X * (local_60->p).X + (sec->ceilingplane).D) *
               (sec->ceilingplane).negiC;
    dVar10 = sector_t::FindShortestUpperAround(sec);
    dVar10 = local_50 - dVar10;
    goto LAB_004e948f;
  }
  dVar8 = (sec->ceilingplane).normal.Y * (local_60->p).Y +
          (sec->ceilingplane).normal.X * (local_60->p).X;
  dVar7 = dVar10 * (sec->ceilingplane).normal.Z;
LAB_004e98c4:
  this->m_TopHeight = -(dVar7 + dVar8);
LAB_004e98d6:
  this->m_Direction = 1;
switchD_004e945b_caseD_8:
  local_48 = (double)CONCAT71(local_48._1_7_,bVar2);
  this->m_Tag = local_3c;
  this->m_Type = type;
  this->m_Crush = local_40;
  this->m_CrushMode = hexencrush;
  pdVar4 = &this->m_TopHeight;
  pdVar1 = &(sec->ceilingplane).D;
  if (this->m_Direction < 0) {
    pdVar4 = pdVar1;
    pdVar1 = &this->m_BottomHeight;
  }
  if ((*pdVar4 - *pdVar1 <= this->m_Speed) &&
     (local_50 = dVar10, DMover::StopInterpolation((DMover *)this,true), dVar10 = local_50,
     (silent & 4U) != 0)) {
    this->m_Silent = 2;
  }
  uVar6 = change & 3;
  if (uVar6 != 0) {
    spec = &this->m_NewSpecial;
    if ((change & 4U) == 0) {
      if (local_38 != (line_t *)0x0) {
        sec = local_38->frontsector;
        (this->m_Texture).texnum = sec->planes[1].Texture.texnum;
        if (uVar6 == 3) {
LAB_004e9a04:
          EVar3 = genCeilingChg;
        }
        else {
          if (uVar6 == 2) goto LAB_004e99f5;
LAB_004e9a0b:
          spec->damagetype = (FName)0x0;
          spec->damageamount = 0;
          (this->m_NewSpecial).special = 0;
          (this->m_NewSpecial).damageinterval = 0;
          (this->m_NewSpecial).leakydamage = 0;
          *(undefined2 *)&(this->m_NewSpecial).field_0xe = 0;
          (this->m_NewSpecial).Flags = 0;
          EVar3 = genCeilingChg0;
        }
LAB_004e9a23:
        this->m_Type = EVar3;
      }
    }
    else {
      if ((type == ceilRaiseToFloor) || (type == ceilLowerToFloor)) {
        psVar5 = sector_t::FindModelFloorSector(sec,dVar10);
      }
      else {
        psVar5 = sector_t::FindModelCeilingSector(sec,dVar10);
      }
      if (psVar5 != (sector_t *)0x0) {
        (this->m_Texture).texnum = psVar5->planes[1].Texture.texnum;
        if (uVar6 == 3) goto LAB_004e9a04;
        if (uVar6 != 2) goto LAB_004e9a0b;
LAB_004e99f5:
        sector_t::GetSpecial(sec,spec);
        EVar3 = genCeilingChgT;
        goto LAB_004e9a23;
      }
    }
  }
  DCeiling::PlayCeilingSound(this);
  bVar2 = local_48._0_1_;
LAB_004e9a33:
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool P_CreateCeiling(sector_t *sec, DCeiling::ECeiling type, line_t *line, int tag, 
				   double speed, double speed2, double height,
				   int crush, int silent, int change, DCeiling::ECrushMode hexencrush)
{
	double		targheight = 0;	// Silence, GCC

	// if ceiling already moving, don't start a second function on it
	if (sec->PlaneMoving(sector_t::ceiling))
	{
		return false;
	}
	
	// new door thinker
	DCeiling *ceiling = new DCeiling (sec, speed, speed2, silent & ~4);
	vertex_t *spot = sec->lines[0]->v1;

	switch (type)
	{
	case DCeiling::ceilCrushAndRaise:
	case DCeiling::ceilCrushRaiseAndStay:
		ceiling->m_TopHeight = sec->ceilingplane.fD();
	case DCeiling::ceilLowerAndCrush:
		targheight = sec->FindHighestFloorPoint (&spot);
		targheight += height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilMoveToValue:
		{
			double diff = height - sec->ceilingplane.ZatPoint (spot);

			targheight = height;
			if (diff < 0)
			{
				ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = -1;
			}
			else
			{
				ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = 1;
			}
		}
		break;

	case DCeiling::ceilLowerToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilRaiseInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilLowerToNearest:
		targheight = sec->FindNextLowestCeiling (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToNearest:
		targheight = sec->FindNextHighestCeiling (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToFloor:
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToFloor:	// [RH] What's this for?
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilLowerByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) - sec->FindShortestUpperAround ();
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) + sec->FindShortestUpperAround ();
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	default:
		break;	// Silence GCC
	}
			
	ceiling->m_Tag = tag;
	ceiling->m_Type = type;
	ceiling->m_Crush = crush;
	ceiling->m_CrushMode = hexencrush;

	// Do not interpolate instant movement ceilings.
	// Note for ZDoomGL: Check to make sure that you update the sector
	// after the ceiling moves, because it hasn't actually moved yet.
	double movedist;

	if (ceiling->m_Direction < 0)
	{
		movedist = sec->ceilingplane.fD() - ceiling->m_BottomHeight;
	}
	else
	{
		movedist = ceiling->m_TopHeight - sec->ceilingplane.fD();
	}
	if (ceiling->m_Speed >= movedist)
	{
		ceiling->StopInterpolation(true);
		if (silent & 4) ceiling->m_Silent = 2;
	}

	// set texture/type change properties
	if (change & 3)		// if a texture change is indicated
	{
		if (change & 4)	// if a numeric model change
		{
			sector_t *modelsec;

			//jff 5/23/98 find model with floor at target height if target
			//is a floor type
			modelsec = (/*type == ceilRaiseToHighest ||*/
				   type == DCeiling::ceilRaiseToFloor ||
				   /*type == ceilLowerToHighest ||*/
				   type == DCeiling::ceilLowerToFloor) ?
				sec->FindModelFloorSector (targheight) :
				sec->FindModelCeilingSector (targheight);
			if (modelsec != NULL)
			{
				ceiling->m_Texture = modelsec->GetTexture(sector_t::ceiling);
				switch (change & 3)
				{
					case 1:		// type is zeroed
						ceiling->m_NewSpecial.Clear();
						ceiling->m_Type = DCeiling::genCeilingChg0;
						break;
					case 2:		// type is copied
						sec->GetSpecial(&ceiling->m_NewSpecial);
						ceiling->m_Type = DCeiling::genCeilingChgT;
						break;
					case 3:		// type is left alone
						ceiling->m_Type = DCeiling::genCeilingChg;
						break;
				}
			}
		}
		else if (line)	// else if a trigger model change
		{
			ceiling->m_Texture = line->frontsector->GetTexture(sector_t::ceiling);
			switch (change & 3)
			{
				case 1:		// type is zeroed
					ceiling->m_NewSpecial.Clear();
					ceiling->m_Type = DCeiling::genCeilingChg0;
					break;
				case 2:		// type is copied
					line->frontsector->GetSpecial(&ceiling->m_NewSpecial);
					ceiling->m_Type = DCeiling::genCeilingChgT;
					break;
				case 3:		// type is left alone
					ceiling->m_Type = DCeiling::genCeilingChg;
					break;
			}
		}
	}

	ceiling->PlayCeilingSound ();
	return ceiling != NULL;
}